

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O1

Index __thiscall AgentBG::Act(AgentBG *this,Index oI,Index prevJoI)

{
  iterator iVar1;
  size_t sVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  JointPolicyPureVector *pJVar4;
  Index IVar5;
  uint uVar6;
  JointBeliefInterface *pJVar7;
  LIndex i;
  MultiAgentDecisionProcessDiscreteInterface *pu;
  Index aI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  uint local_44;
  uint local_40;
  Index local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_44 = 0x7fffffff;
  iVar1._M_current =
       (this->_m_oIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_40 = prevJoI;
  local_3c = oI;
  if (iVar1._M_current ==
      (this->_m_oIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_m_oIs,iVar1,&local_3c);
  }
  else {
    *iVar1._M_current = oI;
    (this->_m_oIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_m_prevJoIs,iVar1,
               &local_40);
  }
  else {
    *iVar1._M_current = local_40;
    (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  sVar2 = this->_m_t;
  if (sVar2 == 2) {
    pDVar3 = ((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->
             _m_DecPOMDP;
    pu = (MultiAgentDecisionProcessDiscreteInterface *)
         ((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8));
    IVar5 = this->_m_jaIfirst;
LAB_0039b225:
    JointBeliefSparse::Update(&this->_m_prevJB,pu,IVar5,local_40);
    i = GetMaximizingBGIndex
                  (this,(JointBeliefInterface *)
                        (&(this->_m_prevJB).field_0x0 + *(long *)(*(long *)&this->_m_prevJB + -0xd0)
                        ));
    pJVar4 = this->_m_jpol;
  }
  else {
    if (sVar2 != 1) {
      if (sVar2 == 0) {
        pJVar7 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                           (&((this->super_AgentDelayedSharedObservations).
                              super_AgentDecPOMDPDiscrete._m_pu)->super_PlanningUnitMADPDiscrete);
        IVar5 = GetMaximizingActionIndex(this,pJVar7);
        (**(code **)((long)*pJVar7 + 8))(pJVar7);
        PlanningUnitMADPDiscrete::JointToIndividualActionIndices
                  (&local_38,
                   &((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)
                    ->super_PlanningUnitMADPDiscrete,IVar5);
        uVar6 = (*(this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.
                  super_SimulationAgent._vptr_SimulationAgent[2])(this);
        local_44 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6];
        this->_m_jaIfirst = IVar5;
        if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_38.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_38.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_0039b286;
      }
      pDVar3 = ((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->
               _m_DecPOMDP;
      pu = (MultiAgentDecisionProcessDiscreteInterface *)
           ((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8));
      IVar5 = (*(this->_m_jpol->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                super_JointPolicy._vptr_JointPolicy[0x11])(this->_m_jpol,(ulong)local_40);
      goto LAB_0039b225;
    }
    pJVar7 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                       (&((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.
                         _m_pu)->super_PlanningUnitMADPDiscrete);
    i = GetMaximizingBGIndex(this,pJVar7);
    (**(code **)((long)*pJVar7 + 8))(pJVar7);
    pJVar4 = this->_m_jpol;
  }
  JPolComponent_VectorImplementation::SetIndex(&pJVar4->super_JPolComponent_VectorImplementation,i);
  (*(this->_m_jpol->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
    _vptr_JointPolicy[7])();
  pJVar4 = this->_m_jpol;
  uVar6 = (*(this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.
            super_SimulationAgent._vptr_SimulationAgent[2])(this);
  local_44 = (*(pJVar4->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
               _vptr_JointPolicy[0x13])(pJVar4,(ulong)uVar6,(ulong)local_3c);
LAB_0039b286:
  this->_m_t = this->_m_t + 1;
  iVar1._M_current =
       (this->_m_aIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->_m_aIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_m_aIs,iVar1,&local_44);
  }
  else {
    *iVar1._M_current = local_44;
    (this->_m_aIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return local_44;
}

Assistant:

Index AgentBG::Act(Index oI, Index prevJoI)
{
    AlphaVector::BGPolicyIndex betaMaxI=INT_MAX;
    Index aI=INT_MAX;

    _m_oIs.push_back(oI);
    _m_prevJoIs.push_back(prevJoI);

#if DEBUG_AgentBG
//     cout << " oIs "; PrintVectorCout(_m_oIs);
//     cout << " prevJoIs "; PrintVectorCout(_m_prevJoIs);
#endif

    switch(_m_t)
    {
    case 0: // we know joint belief at t=0, namely the ISD, so we can
            // use the POMDP action
    {
        JointBeliefInterface* jbi = GetPU()->GetNewJointBeliefFromISD();
        Index ja=GetMaximizingActionIndex(*jbi);
        delete jbi;
        vector<Index> aIs=GetPU()->JointToIndividualActionIndices(ja);
        aI=aIs[GetIndex()];
        _m_jaIfirst=ja;
#if DEBUG_AgentBG
        cout << GetIndex() << ": ja " << ja << " aI " << aI << endl;
#endif
        break;
    }
    case 1: // at t=1, the previous joint belief is the ISD, but now
            // we use the BG policy
    {
        JointBeliefInterface* jbi = GetPU()->GetNewJointBeliefFromISD();
        betaMaxI=GetMaximizingBGIndex(*jbi);
        delete jbi;

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    case 2: // now we start updating the previous joint beliefs, using
            // the joint action we took at t=0
    {
        _m_prevJB.Update(*GetPU()->GetDPOMDPD(),_m_jaIfirst,prevJoI);

        betaMaxI=GetMaximizingBGIndex(_m_prevJB);

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    default: // the rest of the time we use the previous BG jpol to
             // get the joint action to update the joint belief
    {
        _m_prevJB.Update(*GetPU()->GetDPOMDPD(),_m_jpol->GetJointActionIndex(prevJoI),
                         prevJoI);

        betaMaxI=GetMaximizingBGIndex(_m_prevJB);

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    }

    _m_t++;

    _m_aIs.push_back(aI);

#if DEBUG_AgentBG
//     cout << GetIndex() << ": t " << _m_t << " oI " << oI
//          << " prevJoI " << prevJoI << endl;

//     cout << GetIndex() << ":";
//     cout << " prevJaIs "; PrintVectorCout(_m_prevJaIs);
//     cout << " aIs "; PrintVectorCout(_m_aIs);
//     cout << endl;

#endif

    return(aI);
}